

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlDocPtr xmlCtxtParseDocument(xmlParserCtxtPtr ctxt,xmlParserInputPtr input)

{
  uint uVar1;
  uint uVar2;
  xmlParserInputPtr *ppxVar3;
  int iVar4;
  xmlParserInputPtr pxVar5;
  xmlDocPtr pxVar6;
  
  if (input == (xmlParserInputPtr)0x0 || ctxt == (xmlParserCtxtPtr)0x0) {
    xmlFatalErr(ctxt,XML_ERR_ARGUMENT,(char *)0x0);
  }
  else {
    while (uVar2 = ctxt->inputNr, 0 < (int)uVar2) {
      uVar1 = uVar2 - 1;
      ctxt->inputNr = uVar1;
      ppxVar3 = ctxt->inputTab;
      if (uVar2 == 1) {
        pxVar5 = (xmlParserInputPtr)0x0;
      }
      else {
        pxVar5 = ppxVar3[(ulong)uVar2 - 2];
      }
      ctxt->input = pxVar5;
      pxVar5 = ppxVar3[uVar1];
      ppxVar3[uVar1] = (xmlParserInputPtr)0x0;
      xmlFreeInputStream(pxVar5);
    }
    iVar4 = xmlCtxtPushInput(ctxt,input);
    if (-1 < iVar4) {
      xmlParseDocument(ctxt);
      pxVar6 = xmlCtxtGetDocument(ctxt);
      while (uVar2 = ctxt->inputNr, 0 < (int)uVar2) {
        uVar1 = uVar2 - 1;
        ctxt->inputNr = uVar1;
        ppxVar3 = ctxt->inputTab;
        if (uVar2 == 1) {
          pxVar5 = (xmlParserInputPtr)0x0;
        }
        else {
          pxVar5 = ppxVar3[(ulong)uVar2 - 2];
        }
        ctxt->input = pxVar5;
        pxVar5 = ppxVar3[uVar1];
        ppxVar3[uVar1] = (xmlParserInputPtr)0x0;
        xmlFreeInputStream(pxVar5);
      }
      return pxVar6;
    }
  }
  xmlFreeInputStream(input);
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCtxtParseDocument(xmlParserCtxtPtr ctxt, xmlParserInputPtr input)
{
    xmlDocPtr ret = NULL;

    if ((ctxt == NULL) || (input == NULL)) {
        xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
        xmlFreeInputStream(input);
        return(NULL);
    }

    /* assert(ctxt->inputNr == 0); */
    while (ctxt->inputNr > 0)
        xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        return(NULL);
    }

    xmlParseDocument(ctxt);

    ret = xmlCtxtGetDocument(ctxt);

    /* assert(ctxt->inputNr == 1); */
    while (ctxt->inputNr > 0)
        xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    return(ret);
}